

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O1

void dirNexScreenTile(void)

{
  bool bVar1;
  char *badValueMessage;
  char *message;
  aint tileArgs [5];
  bool optionals [5];
  uint local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  uint local_18;
  bool local_8 [8];
  
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  local_18 = 1;
  local_8[4] = true;
  local_8[0] = false;
  local_8[1] = false;
  local_8[2] = false;
  local_8[3] = false;
  bVar1 = getIntArguments<5>(&lp,(aint (*) [5])&local_28,(bool (*) [5])local_8);
  if ((((bVar1) && (local_28 < 0x100)) && (uStack_24 < 0x100)) &&
     (((uStack_20 < 0x100 && (uStack_1c < 0x100)) && (local_18 < 2)))) {
    if (nex.reqFileVersion != 2) {
      nex.minFileVersion = 3;
      SNexFile::writePalette(&nex);
      nex.h.screen = nex.h.screen | 0x40;
      nex.h.screen2 = '\x03';
      nex.h.tilesScrConfig[0] = (byte)local_28;
      nex.h.tilesScrConfig[1] = (byte)uStack_24;
      nex.h.tilesScrConfig[2] = (byte)uStack_20;
      nex.h.tilesScrConfig[3] = (byte)uStack_1c;
      if (local_18 == 0) {
        nex.h.screen2 = '\x03';
        return;
      }
      saveBank(0,5,false);
      return;
    }
    message = "[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.";
    badValueMessage = (char *)0x0;
  }
  else {
    message = 
    "[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]"
    ;
    badValueMessage = bp;
  }
  Error(message,badValueMessage,SUPPRESS);
  return;
}

Assistant:

static void dirNexScreenTile() {
// ;; SCREEN TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]
	// parse arguments
	aint tileArgs[5] = {0, 0, 0, 0, 1};
	const bool optionals[] = {false, false, false, false, true};
	if (!getIntArguments<5>(lp, tileArgs, optionals)
			|| tileArgs[0] < 0 || 255 < tileArgs[0]
			|| tileArgs[1] < 0 || 255 < tileArgs[1]
			|| tileArgs[2] < 0 || 255 < tileArgs[2]
			|| tileArgs[3] < 0 || 255 < tileArgs[3]
			|| tileArgs[4] < 0 || 1 < tileArgs[4]) {
		Error("[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]", bp, SUPPRESS);
		return;
	}
	// check file version and set it up to V1.3
	if (2 == nex.reqFileVersion) {
		Error("[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.", NULL, SUPPRESS);
		return;
	}
	nex.minFileVersion = 3;
	// write palette into file (or update nex.h.screen with NOPAL flag if no palette was defined)
	nex.writePalette();
	nex.h.screen |= SNexHeader::SCR_EXT2;
	nex.h.screen2 = SNexHeader::SCR2_tilemap;
	nex.h.tilesScrConfig[0] = static_cast<byte>(tileArgs[0]);
	nex.h.tilesScrConfig[1] = static_cast<byte>(tileArgs[1]);
	nex.h.tilesScrConfig[2] = static_cast<byte>(tileArgs[2]);
	nex.h.tilesScrConfig[3] = static_cast<byte>(tileArgs[3]);
	// write Bank 5 into file, if requested/default
	if (0 == tileArgs[4]) return;		// suppressed
	saveBank(getNexBankIndex(5), 5);
}